

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TransformFeedbackTypeValidator::validateBuiltinVariable
          (TransformFeedbackTypeValidator *this,string *resource,GLint propValue,
          string *implementationName)

{
  bool bVar1;
  DataType DVar2;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  allocator<char> local_371;
  string local_370;
  char *local_350;
  MessageBuilder local_348;
  char *local_1c8 [3];
  MessageBuilder local_1b0;
  DataType local_2c;
  string *psStack_28;
  DataType varType;
  string *implementationName_local;
  string *psStack_18;
  GLint propValue_local;
  string *resource_local;
  TransformFeedbackTypeValidator *this_local;
  
  local_2c = TYPE_INVALID;
  psStack_28 = implementationName;
  implementationName_local._4_4_ = propValue;
  psStack_18 = resource;
  resource_local = (string *)this;
  bVar1 = std::operator==(resource,"gl_Position");
  if (bVar1) {
    local_2c = TYPE_FLOAT_VEC4;
  }
  pTVar3 = tcu::TestContext::getLog
                     ((this->super_TransformFeedbackResourceValidator).super_PropValidator.m_testCtx
                     );
  tcu::TestLog::operator<<(&local_1b0,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_1b0,(char (*) [27])"Verifying type, expecting ");
  local_1c8[0] = glu::getDataTypeName(local_2c);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_1c8);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  DVar2 = glu::getDataTypeFromGLType(implementationName_local._4_4_);
  if (DVar2 != local_2c) {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TransformFeedbackResourceValidator).super_PropValidator.
                        m_testCtx);
    tcu::TestLog::operator<<(&local_348,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_348,(char (*) [13])"\tError, got ");
    DVar2 = glu::getDataTypeFromGLType(implementationName_local._4_4_);
    local_350 = glu::getDataTypeName(DVar2);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_350);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_348);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_370,"resource type invalid",&local_371);
    PropValidator::setError((PropValidator *)this,&local_370);
    std::__cxx11::string::~string((string *)&local_370);
    std::allocator<char>::~allocator(&local_371);
  }
  return;
}

Assistant:

void TransformFeedbackTypeValidator::validateBuiltinVariable (const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	DE_UNREF(implementationName);

	glu::DataType varType = glu::TYPE_INVALID;

	if (resource == "gl_Position")
		varType = glu::TYPE_FLOAT_VEC4;
	else
		DE_ASSERT(false);

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying type, expecting " << glu::getDataTypeName(varType) << tcu::TestLog::EndMessage;
	if (glu::getDataTypeFromGLType(propValue) != varType)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << glu::getDataTypeName(glu::getDataTypeFromGLType(propValue)) << tcu::TestLog::EndMessage;
		setError("resource type invalid");
	}
	return;
}